

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::RowObjPS::execute(RowObjPS *this,
                   VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *param_4,
                   DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                            *rStatus,bool isOptimal)

{
  int iVar1;
  pointer pnVar2;
  VarStatus *pVVar3;
  long lVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  VarStatus VVar6;
  pointer pnVar7;
  byte bVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  
  bVar8 = 0;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,
             &(s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,
             &(x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
  iVar1 = this->m_i;
  pnVar2 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = &result;
  pnVar7 = pnVar2 + iVar1;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar7->m_backend).data._M_elems[0] = *(undefined4 *)pnVar5;
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar8 * -2 + 1) * 4);
    pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar8 * -2 + 1) * 4);
  }
  pnVar2[iVar1].m_backend.exp = result.m_backend.exp;
  pnVar2[iVar1].m_backend.neg = result.m_backend.neg;
  pnVar2[iVar1].m_backend.fpclass = result.m_backend.fpclass;
  pnVar2[iVar1].m_backend.prec_elem = result.m_backend.prec_elem;
  if (rStatus->data[this->m_i] != BASIC) {
    iVar1 = this->m_j;
    pVVar3 = cStatus->data;
    VVar6 = pVVar3[iVar1];
    if (VVar6 == ON_UPPER) {
      VVar6 = ON_LOWER;
    }
    else if (VVar6 == ON_LOWER) {
      VVar6 = ON_UPPER;
    }
    rStatus->data[this->m_i] = VVar6;
    pVVar3[iVar1] = ZERO;
  }
  return;
}

Assistant:

void SPxMainSM<R>::RowObjPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
                                     VectorBase<R>&,
                                     DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
                                     DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   s[m_i] = s[m_i] - x[m_j];

   assert(rStatus[m_i] != SPxSolverBase<R>::UNDEFINED);
   assert(cStatus[m_j] != SPxSolverBase<R>::UNDEFINED);
   assert(rStatus[m_i] != SPxSolverBase<R>::BASIC || cStatus[m_j] != SPxSolverBase<R>::BASIC);

   SPxOut::debug(this, "RowObjPS: removing slack column {} ({}) for row {} ({}).\n", m_j, cStatus[m_j],
                 m_i, rStatus[m_i]);

   if(rStatus[m_i] != SPxSolverBase<R>::BASIC)
   {
      switch(cStatus[m_j])
      {
      case SPxSolverBase<R>::ON_UPPER:
         rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
         break;

      case SPxSolverBase<R>::ON_LOWER:
         rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;
         break;

      default:
         rStatus[m_i] = cStatus[m_j];
      }

      // otherwise checkBasisDim() may fail
      cStatus[m_j] = SPxSolverBase<R>::ZERO;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      assert(false);
      throw SPxInternalCodeException("XMAISM15 Dimension doesn't match after this step.");
   }

#endif
}